

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.cpp
# Opt level: O0

AggregateFunction * duckdb::StdDevSampFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  FunctionNullHandling in_stack_000000bf;
  LogicalType *in_stack_000000c0;
  LogicalType *in_stack_000000c8;
  LogicalTypeId in_stack_ffffffffffffffcf;
  LogicalType *in_stack_ffffffffffffffd0;
  
  LogicalType::LogicalType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  LogicalType::LogicalType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  AggregateFunction::
  UnaryAggregate<duckdb::StddevState,double,double,duckdb::STDDevSampOperation,(duckdb::AggregateDestructorType)0>
            (in_stack_000000c8,in_stack_000000c0,in_stack_000000bf);
  LogicalType::~LogicalType((LogicalType *)0x1b11d09);
  LogicalType::~LogicalType((LogicalType *)0x1b11d13);
  return in_RDI;
}

Assistant:

AggregateFunction StdDevSampFun::GetFunction() {
	return AggregateFunction::UnaryAggregate<StddevState, double, double, STDDevSampOperation>(LogicalType::DOUBLE,
	                                                                                           LogicalType::DOUBLE);
}